

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::DecodePsbtInput::DecodePsbtInput(DecodePsbtInput *this,DecodePsbtInput *param_1)

{
  DecodePsbtInput *param_1_local;
  DecodePsbtInput *this_local;
  
  core::JsonClassBase<cfd::js::api::json::DecodePsbtInput>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::DecodePsbtInput>,
             &param_1->super_JsonClassBase<cfd::js::api::json::DecodePsbtInput>);
  (this->super_JsonClassBase<cfd::js::api::json::DecodePsbtInput>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodePsbtInput_01b47990;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items,&param_1->ignore_items);
  std::__cxx11::string::string
            ((string *)&this->non_witness_utxo_hex_,(string *)&param_1->non_witness_utxo_hex_);
  DecodeRawTransactionResponse::DecodeRawTransactionResponse
            (&this->non_witness_utxo_,&param_1->non_witness_utxo_);
  DecodePsbtUtxo::DecodePsbtUtxo(&this->witness_utxo_,&param_1->witness_utxo_);
  core::
  JsonObjectVector<cfd::js::api::json::PsbtSignatureData,_cfd::js::api::PsbtSignatureDataStruct>::
  JsonObjectVector(&this->partial_signatures_,&param_1->partial_signatures_);
  std::__cxx11::string::string((string *)&this->sighash_,(string *)&param_1->sighash_);
  PsbtScriptData::PsbtScriptData(&this->redeem_script_,&param_1->redeem_script_);
  PsbtScriptData::PsbtScriptData(&this->witness_script_,&param_1->witness_script_);
  core::JsonObjectVector<cfd::js::api::json::PsbtBip32Data,_cfd::js::api::PsbtBip32DataStruct>::
  JsonObjectVector(&this->bip32_derivs_,&param_1->bip32_derivs_);
  DecodeUnlockingScript::DecodeUnlockingScript(&this->final_scriptsig_,&param_1->final_scriptsig_);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->final_scriptwitness_,&param_1->final_scriptwitness_);
  core::JsonObjectVector<cfd::js::api::json::PsbtMapData,_cfd::js::api::PsbtMapDataStruct>::
  JsonObjectVector(&this->unknown_,&param_1->unknown_);
  return;
}

Assistant:

DecodePsbtInput() {
    CollectFieldName();
  }